

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerScopedDelFld
          (Lowerer *this,Instr *delFldInstr,JnHelperMethod helperMethod,bool withInlineCache,
          bool strictMode)

{
  IntConstOpnd *opndArg;
  Instr *pIVar1;
  undefined3 in_register_00000081;
  
  opndArg = IR::IntConstOpnd::New
                      ((ulong)CONCAT31(in_register_00000081,strictMode),TyInt32,this->m_func,true);
  pIVar1 = LowererMD::LoadHelperArgument(&this->m_lowererMD,delFldInstr,&opndArg->super_Opnd);
  LowerScopedLdFld(this,delFldInstr,helperMethod,withInlineCache);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerScopedDelFld(IR::Instr * delFldInstr, IR::JnHelperMethod helperMethod, bool withInlineCache, bool strictMode)
{
    IR::Instr *instrPrev;

    Js::PropertyOperationFlags propertyOperationFlag = Js::PropertyOperation_None;

    if (strictMode)
    {
        propertyOperationFlag = Js::PropertyOperation_StrictMode;
    }

    instrPrev = m_lowererMD.LoadHelperArgument(delFldInstr, IR::IntConstOpnd::New((IntConstType)propertyOperationFlag, TyInt32, m_func, true));

    LowerScopedLdFld(delFldInstr, helperMethod, withInlineCache);

    return instrPrev;
}